

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classweight.cc
# Opt level: O0

void CLASSWEIGHTS::predict_or_learn<true,4>(classweights *cweights,single_learner *base,example *ec)

{
  long in_RDX;
  size_t in_RSI;
  example *in_RDI;
  float fVar1;
  
  fVar1 = classweights::get_class_weight((classweights *)base,ec._4_4_);
  *(float *)(in_RDX + 0x6870) = fVar1 * *(float *)(in_RDX + 0x6870);
  LEARNER::learner<char,_example>::learn((learner<char,_example> *)ec,in_RDI,in_RSI);
  return;
}

Assistant:

static void predict_or_learn(classweights& cweights, LEARNER::single_learner& base, example& ec)
{
  switch (pred_type)
  {
    case prediction_type::scalar:
      ec.weight *= cweights.get_class_weight((uint32_t)ec.l.simple.label);
      break;
    case prediction_type::multiclass:
      ec.weight *= cweights.get_class_weight(ec.l.multi.label);
      break;
    default:
      // suppress the warning
      break;
  }

  if (is_learn)
    base.learn(ec);
  else
    base.predict(ec);
}